

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O0

ostream * perf::operator<<(ostream *o,timer *timer)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  duration *in_stack_00000098;
  ostringstream strm;
  timer *in_stack_fffffffffffffdd8;
  string local_200 [32];
  rep local_1e0;
  string local_1d8 [48];
  string local_1a8 [32];
  ostringstream local_188 [304];
  string *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  format_code_position
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::operator<<((ostream *)local_188,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x40)) {
    poVar1 = std::operator<<((ostream *)local_188,"-");
    std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x40));
  }
  poVar1 = std::operator<<((ostream *)local_188,": ");
  local_1e0 = (rep)inline_timer::get_duration(in_stack_fffffffffffffdd8);
  format_duration_abi_cxx11_(in_stack_00000098);
  std::operator<<(poVar1,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::str();
  std::operator<<(in_RDI,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const inline_timer &timer)
    {
        std::ostringstream strm;
        strm << format_code_position(timer.m_file, timer.m_first_line, timer.m_function);
        if (timer.m_last_line > timer.m_first_line)
            strm << "-" << timer.m_last_line;
        strm << ": " << format_duration(timer.get_duration());
        o << strm.str();
        return o;
    }